

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int nsc_line_to_tag(char *buf,size_t size,char *tag,size_t max_tag,lws_usec_t *pexpiry)

{
  ulong uVar1;
  char cVar2;
  longlong lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  char col [64];
  long local_a0;
  int local_80;
  char local_78 [72];
  
  iVar7 = 1;
  if (2 < size) {
    uVar5 = 0;
    local_a0 = 0;
    iVar7 = 0;
    uVar8 = 0;
    do {
      uVar4 = 0;
      while (uVar1 = uVar4, buf[uVar4 + uVar5] != '\t') {
        uVar1 = uVar4 + 1;
        local_78[uVar4] = buf[uVar4 + uVar5];
        if ((size <= uVar5 + 1 + uVar4) || (bVar9 = 0x3d < uVar4, uVar4 = uVar1, bVar9)) break;
      }
      local_78[uVar1 & 0xffffffff] = '\0';
      cVar2 = buf[uVar5 + uVar1];
      switch(uVar8) {
      case 0:
      case 2:
      case 5:
        local_80 = (int)max_tag;
        if (local_80 < iVar7 + (int)uVar1 + 2) {
          return 1;
        }
        if (iVar7 == 0) {
          iVar6 = 0;
        }
        else {
          iVar6 = iVar7 + 1;
          tag[iVar7] = '|';
        }
        memcpy(tag + iVar6,local_78,uVar1 & 0xffffffff);
        iVar7 = iVar6 + (int)uVar1;
        tag[iVar7] = '\0';
        break;
      case 4:
        lVar3 = atoll(local_78);
        local_a0 = lVar3 * 1000000;
      }
      uVar5 = uVar5 + uVar1 + (ulong)(cVar2 == '\t');
    } while ((uVar5 < size) && (bVar9 = uVar8 < 5, uVar8 = uVar8 + 1, bVar9));
    if (pexpiry != (lws_usec_t *)0x0) {
      *pexpiry = local_a0;
    }
    iVar7 = 0;
    _lws_log(8,"%s: %.*s: tag \'%s\'\n","nsc_line_to_tag",size & 0xffffffff,buf,tag);
  }
  return iVar7;
}

Assistant:

static int
nsc_line_to_tag(const char *buf, size_t size, char *tag, size_t max_tag,
		lws_usec_t *pexpiry)
{
	int n, idx = 0, tl = 0;
	lws_usec_t expiry = 0;
	size_t bn = 0;
	char col[64];

	if (size < 3)
		return 1;

	while (bn < size && idx <= NSC_COL_NAME) {

		n = 0;
		while (bn < size && n < (int)sizeof(col) - 1 &&
		       buf[bn] != '\t')
			col[n++] = buf[bn++];
		col[n] = '\0';
		if (buf[bn] == '\t')
			bn++;

		switch (idx) {
		case NSC_COL_EXPIRY:
			expiry = (lws_usec_t)((unsigned long long)atoll(col) *
					(lws_usec_t)LWS_US_PER_SEC);
			break;

		case NSC_COL_HOST:
		case NSC_COL_PATH:
		case NSC_COL_NAME:

			/*
			 * As we match the pieces of the wildcard,
			 * compose the matches into a specific tag
			 */

			if (tl + n + 2 > (int)max_tag)
				return 1;
			if (tl)
				tag[tl++] = LWSCTAG_SEP;
			memcpy(tag + tl, col, (size_t)n);
			tl += n;
			tag[tl] = '\0';
			break;
		default:
			break;
		}

		idx++;
	}

	if (pexpiry)
		*pexpiry = expiry;

	lwsl_info("%s: %.*s: tag '%s'\n", __func__, (int)size, buf, tag);

	return 0;
}